

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtMiniSDF.cpp
# Opt level: O3

bool __thiscall
cbtMiniSDF::interpolate
          (cbtMiniSDF *this,uint field_id,double *dist,cbtVector3 *x,cbtVector3 *gradient)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  undefined8 uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  cbtCell32 *pcVar9;
  double *pdVar10;
  ulong uVar11;
  float fVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  cbtMiniSDF *this_00;
  cbtScalar *pcVar22;
  uint uVar23;
  long lVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  undefined1 auVar46 [16];
  undefined8 in_XMM10_Qb;
  cbtVector3 xi;
  cbtShapeMatrix N;
  cbtShapeGradients dN;
  cbtVector3 local_358;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  cbtShapeMatrix local_330;
  cbtShapeGradients local_230;
  
  if (this->m_isValid == true) {
    uVar21 = *(ulong *)(this->m_domain).m_min.m_floats;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar21;
    uVar3 = *(ulong *)x->m_floats;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar3;
    uVar13 = vcmpps_avx512vl(auVar26,auVar30,5);
    if ((uVar13 & 2) == 0) {
      return false;
    }
    auVar27 = vmovshdup_avx(auVar26);
    if ((this->m_domain).m_max.m_floats[1] < auVar27._0_4_) {
      return false;
    }
    fVar34 = (this->m_domain).m_min.m_floats[2];
    fVar1 = x->m_floats[2];
    if (fVar1 < fVar34) {
      return false;
    }
    if ((this->m_domain).m_max.m_floats[2] < fVar1) {
      return false;
    }
    if ((uVar13 & 1) == 0) {
      return false;
    }
    if ((this->m_domain).m_max.m_floats[0] < (float)uVar3) {
      return false;
    }
    uVar4 = *(undefined8 *)(this->m_inv_cell_size).m_floats;
    uVar13 = *(ulong *)this->m_resolution;
    iVar15 = (int)uVar13;
    uVar23 = vcvttss2usi_avx512f(ZEXT416((uint)((fVar1 - fVar34) *
                                               (this->m_inv_cell_size).m_floats[2])));
    auVar26 = vsubps_avx(auVar26,auVar30);
    auVar27._0_4_ = auVar26._0_4_ * (float)uVar4;
    auVar27._4_4_ = auVar26._4_4_ * (float)((ulong)uVar4 >> 0x20);
    auVar27._8_4_ = auVar26._8_4_ * 0.0;
    auVar27._12_4_ = auVar26._12_4_ * 0.0;
    auVar26 = vcvttps2udq_avx512vl(auVar27);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar13;
    uVar14 = vpcmpud_avx512vl(auVar38,auVar26,6);
    iVar16 = auVar26._0_4_;
    if ((uVar14 & 1) == 0) {
      iVar16 = iVar15 + -1;
    }
    iVar17 = (int)(uVar13 >> 0x20);
    iVar18 = auVar26._4_4_;
    if ((uVar14 & 2) == 0) {
      iVar18 = iVar17 + -1;
    }
    uVar20 = this->m_resolution[2] - 1;
    if (uVar23 < this->m_resolution[2]) {
      uVar20 = uVar23;
    }
    uVar23 = (uVar20 * iVar17 + iVar18) * iVar15 + iVar16;
    this_00 = (cbtMiniSDF *)(long)(int)uVar23;
    lVar24 = (long)(int)(this->m_cell_map).m_data[(int)field_id].m_data[(long)this_00];
    if (lVar24 != -1) {
      uVar11 = (ulong)uVar23 % (ulong)(uint)(iVar17 * iVar15);
      fVar2 = (this->m_cell_size).m_floats[2];
      auVar30 = vcvtusi2sd_avx512f(in_ZMM6._0_16_,uVar23 / (uint)(iVar17 * iVar15));
      uVar14 = *(ulong *)(this->m_cell_size).m_floats;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = uVar14;
      auVar26 = vpinsrd_avx(ZEXT416((uint)(uVar11 % (uVar13 & 0xffffffff))),
                            (int)(uVar11 / (uVar13 & 0xffffffff)),1);
      auVar27 = vcvtudq2pd_avx512vl(auVar26);
      fVar34 = fVar34 + (float)(auVar30._0_8_ * (double)fVar2);
      auVar26 = vcvtps2pd_avx(auVar40);
      fVar2 = fVar2 + fVar34;
      auVar42._0_8_ = auVar27._0_8_ * auVar26._0_8_;
      auVar42._8_8_ = auVar27._8_8_ * auVar26._8_8_;
      auVar46._8_4_ = 0x40000000;
      auVar46._0_8_ = 0x4000000040000000;
      auVar46._12_4_ = 0x40000000;
      fVar12 = fVar2 - fVar34;
      auVar26 = vcvtpd2ps_avx(auVar42);
      auVar31._0_4_ = (float)uVar21 + auVar26._0_4_;
      auVar31._4_4_ = (float)(uVar21 >> 0x20) + auVar26._4_4_;
      auVar31._8_4_ = auVar26._8_4_ + 0.0;
      auVar31._12_4_ = auVar26._12_4_ + 0.0;
      auVar41._0_4_ = (float)uVar14 + auVar31._0_4_;
      auVar41._4_4_ = (float)(uVar14 >> 0x20) + auVar31._4_4_;
      auVar41._8_4_ = auVar31._8_4_ + 0.0;
      auVar41._12_4_ = auVar31._12_4_ + 0.0;
      auVar26 = vsubps_avx(auVar41,auVar31);
      auVar32._0_4_ = auVar31._0_4_ + auVar41._0_4_;
      auVar32._4_4_ = auVar31._4_4_ + auVar41._4_4_;
      auVar32._8_4_ = auVar31._8_4_ + auVar41._8_4_;
      auVar32._12_4_ = auVar31._12_4_ + auVar41._12_4_;
      _local_348 = vdivps_avx(auVar46,auVar26);
      auVar26 = vdivps_avx(auVar32,auVar26);
      fVar45 = 2.0 / fVar12;
      auVar28._0_4_ = local_348._0_4_ * (float)uVar3;
      auVar28._4_4_ = local_348._4_4_ * (float)(uVar3 >> 0x20);
      auVar28._8_4_ = local_348._8_4_ * 0.0;
      auVar28._12_4_ = local_348._12_4_ * 0.0;
      auVar26 = vsubps_avx(auVar28,auVar26);
      local_358.m_floats =
           (cbtScalar  [4])
           vinsertps_avx(auVar26,ZEXT416((uint)(fVar45 * fVar1 - (fVar34 + fVar2) / fVar12)),0x28);
      pcVar9 = (this->m_cells).m_data[(int)field_id].m_data;
      if (gradient != (cbtVector3 *)0x0) {
        shape_function_(&local_330,this_00,&local_358,&local_230);
        gradient->m_floats[0] = 0.0;
        gradient->m_floats[1] = 0.0;
        gradient->m_floats[2] = 0.0;
        gradient->m_floats[3] = 0.0;
        pdVar10 = (this->m_nodes).m_data[(int)field_id].m_data;
        dVar5 = pdVar10[(int)pcVar9[lVar24].m_cells[0]];
        auVar37 = ZEXT864((ulong)dVar5);
        if ((dVar5 != 1.79769313486232e+308) || (NAN(dVar5))) {
          auVar36 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar33 = ZEXT1664(ZEXT816(0) << 0x40);
          uVar21 = 0xffffffffffffffff;
          pcVar22 = local_230.m_vec[0].m_floats + 2;
          auVar39 = ZEXT1664(ZEXT816(0) << 0x40);
          do {
            auVar6._8_8_ = 0;
            auVar6._0_8_ = *(ulong *)((cbtVector3 *)(pcVar22 + -2))->m_floats;
            auVar26 = vcvtps2pd_avx(auVar6);
            auVar30 = vcvtps2pd_avx(auVar39._0_16_);
            auVar43._8_8_ = auVar37._0_8_;
            auVar43._0_8_ = auVar37._0_8_;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = local_330.m_vec[uVar21 + 1];
            auVar27 = vfmadd231sd_fma(auVar33._0_16_,auVar37._0_16_,auVar7);
            auVar33 = ZEXT1664(auVar27);
            auVar35._0_8_ = (double)auVar36._0_4_;
            auVar35._8_8_ = auVar36._8_8_;
            auVar26 = vfmadd213pd_fma(auVar43,auVar26,auVar30);
            auVar26 = vcvtpd2ps_avx(auVar26);
            auVar39 = ZEXT1664(auVar26);
            auVar44._0_8_ = (double)*pcVar22;
            auVar44._8_8_ = in_XMM10_Qb;
            auVar30 = vfmadd231sd_fma(auVar35,auVar37._0_16_,auVar44);
            fVar34 = (float)auVar30._0_8_;
            auVar36 = ZEXT1664(CONCAT124(auVar30._4_12_,fVar34));
            if (uVar21 == 0x1e) {
              auVar29._0_4_ = (float)local_348._0_4_ * auVar26._0_4_;
              auVar29._4_4_ = (float)local_348._4_4_ * auVar26._4_4_;
              auVar29._8_4_ = fStack_340 * auVar26._8_4_;
              auVar29._12_4_ = fStack_33c * auVar26._12_4_;
              uVar4 = vmovlps_avx(auVar29);
              *(undefined8 *)gradient->m_floats = uVar4;
              gradient->m_floats[2] = fVar34 * fVar45;
              *dist = auVar27._0_8_;
              return true;
            }
            lVar19 = uVar21 + 2;
            uVar21 = uVar21 + 1;
            pcVar22 = pcVar22 + 4;
            dVar5 = pdVar10[(int)pcVar9[lVar24].m_cells[lVar19]];
            auVar37 = ZEXT864((ulong)dVar5);
          } while ((dVar5 != 1.79769313486232e+308) || (NAN(dVar5)));
          bVar25 = 0x1e < uVar21;
          uVar4 = vmovlps_avx(auVar26);
          *(undefined8 *)gradient->m_floats = uVar4;
          gradient->m_floats[2] = fVar34;
        }
        else {
          bVar25 = false;
        }
        gradient->m_floats[0] = 0.0;
        gradient->m_floats[1] = 0.0;
        gradient->m_floats[2] = 0.0;
        gradient->m_floats[3] = 0.0;
        return bVar25;
      }
      shape_function_((cbtShapeMatrix *)&local_230,this_00,&local_358,(cbtShapeGradients *)0x0);
      pdVar10 = (this->m_nodes).m_data[(int)field_id].m_data;
      dVar5 = pdVar10[(int)pcVar9[lVar24].m_cells[0]];
      auVar37 = ZEXT864((ulong)dVar5);
      if ((dVar5 == 1.79769313486232e+308) && (!NAN(dVar5))) {
        return false;
      }
      auVar33 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar21 = 0xffffffffffffffff;
      do {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *(ulong *)(local_230.m_vec[0].m_floats + uVar21 * 2 + 2);
        auVar26 = vfmadd132sd_fma(auVar37._0_16_,auVar33._0_16_,auVar8);
        auVar33 = ZEXT1664(auVar26);
        if (uVar21 == 0x1e) {
          *dist = auVar26._0_8_;
          return true;
        }
        lVar19 = uVar21 + 2;
        uVar21 = uVar21 + 1;
        dVar5 = pdVar10[(int)pcVar9[lVar24].m_cells[lVar19]];
        auVar37 = ZEXT864((ulong)dVar5);
      } while ((dVar5 != 1.79769313486232e+308) || (NAN(dVar5)));
      return 0x1e < uVar21;
    }
  }
  return false;
}

Assistant:

bool cbtMiniSDF::interpolate(unsigned int field_id, double& dist, cbtVector3 const& x,
							cbtVector3* gradient) const
{
	cbtAssert(m_isValid);
	if (!m_isValid)
		return false;

	if (!m_domain.contains(x))
		return false;

	cbtVector3 tmpmi = ((x - m_domain.min()) * (m_inv_cell_size));  //.cast<unsigned int>().eval();
	unsigned int mi[3] = {(unsigned int)tmpmi[0], (unsigned int)tmpmi[1], (unsigned int)tmpmi[2]};
	if (mi[0] >= m_resolution[0])
		mi[0] = m_resolution[0] - 1;
	if (mi[1] >= m_resolution[1])
		mi[1] = m_resolution[1] - 1;
	if (mi[2] >= m_resolution[2])
		mi[2] = m_resolution[2] - 1;
	cbtMultiIndex mui;
	mui.ijk[0] = mi[0];
	mui.ijk[1] = mi[1];
	mui.ijk[2] = mi[2];
	int i = multiToSingleIndex(mui);
	unsigned int i_ = m_cell_map[field_id][i];
	if (i_ == UINT_MAX)
		return false;

	cbtAlignedBox3d sd = subdomain(i);
	i = i_;
	cbtVector3 d = sd.m_max - sd.m_min;  //.diagonal().eval();

	cbtVector3 denom = (sd.max() - sd.min());
	cbtVector3 c0 = cbtVector3(2.0, 2.0, 2.0) / denom;
	cbtVector3 c1 = (sd.max() + sd.min()) / denom;
	cbtVector3 xi = (c0 * x - c1);

	cbtCell32 const& cell = m_cells[field_id][i];
	if (!gradient)
	{
		//auto phi = m_coefficients[field_id][i].dot(shape_function_(xi, 0));
		double phi = 0.0;
		cbtShapeMatrix N = shape_function_(xi, 0);
		for (unsigned int j = 0u; j < 32u; ++j)
		{
			unsigned int v = cell.m_cells[j];
			double c = m_nodes[field_id][v];
			if (c == DBL_MAX)
			{
				return false;
				;
			}
			phi += c * N[j];
		}

		dist = phi;
		return true;
	}

	cbtShapeGradients dN;
	cbtShapeMatrix N = shape_function_(xi, &dN);

	double phi = 0.0;
	gradient->setZero();
	for (unsigned int j = 0u; j < 32u; ++j)
	{
		unsigned int v = cell.m_cells[j];
		double c = m_nodes[field_id][v];
		if (c == DBL_MAX)
		{
			gradient->setZero();
			return false;
		}
		phi += c * N[j];
		(*gradient)[0] += c * dN(j, 0);
		(*gradient)[1] += c * dN(j, 1);
		(*gradient)[2] += c * dN(j, 2);
	}
	(*gradient) *= c0;
	dist = phi;
	return true;
}